

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

pair<int,_int> __thiscall Board::eliminate(Board *this,Block *block)

{
  bool bVar1;
  byte bVar2;
  int i;
  long lVar3;
  ulong uVar4;
  pair<int,_int> pVar5;
  long lVar6;
  ulong uVar7;
  int count;
  
  count = 0;
  lVar3 = 1;
  do {
    if (this->rows[lVar3] == 0xfff) {
      count = count + 1;
    }
    else if (this->rows[lVar3] == 0x801) break;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x15);
  if (count == 0) {
    pVar5.first = 0;
    pVar5.second = 0;
    return pVar5;
  }
  uVar4 = 0;
  if (block != (Block *)0x0) {
    lVar3 = 0;
    do {
      uVar4 = (ulong)((int)uVar4 +
                     (uint)(this->rows
                            [(long)blockShape[block->t][block->o][lVar3 * 2] + (long)block->x] ==
                           0xfff));
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    uVar4 = uVar4 << 0x20;
  }
  lVar3 = 0;
  uVar7 = 0x14;
  do {
    if (this->rows[uVar7] == 0xfff) {
      lVar6 = lVar3;
      if (uVar7 < 0x14) {
        do {
          this->rows[lVar6 + 0x14] = this->rows[lVar6 + 0x15];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0);
      }
      bVar2 = (byte)uVar7;
      this->rows[0x14] = 0x801;
      lVar6 = 0;
      do {
        this->cols[lVar6 + 1] =
             (this->cols[lVar6 + 1] >> (bVar2 + 1 & 0x1f)) << (bVar2 & 0x1f) |
             this->cols[lVar6 + 1] & (2 << (bVar2 & 0x1f)) - 1U;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 10);
    }
    lVar3 = lVar3 + -1;
    bVar1 = 1 < uVar7;
    uVar7 = uVar7 - 1;
  } while (bVar1);
  return (pair<int,_int>)(uVar4 | (uint)count);
}

Assistant:

std::pair<int, int> Board::eliminate(const Block *block){
    int count = 0;
    for (int i = 1; i <= MAPHEIGHT; ++i) 
        if (rows[i] == EMPTY_ROW) break;
            else if (rows[i] == FULL_ROW)
                ++count;

    if (count == 0)
        return std::make_pair(0, 0);
    int count2 = 0;
    if (block) {
        auto shape = blockShape[block->t][block->o];
        for (int i = 0; i < 4; ++i)
            if (rows[block->x + shape[2 * i]] == FULL_ROW)
                ++count2;
    }

    for (int i = MAPHEIGHT; i > 0; --i)
        if (rows[i] == FULL_ROW){
            for (int j = i; j < MAPHEIGHT; ++j)
                rows[j] = rows[j + 1];
            rows[MAPHEIGHT] = EMPTY_ROW;
            for (int j = 1; j <= MAPWIDTH; ++j)
                cols[j] = (cols[j] & ((1 << (i + 1)) - 1)) |
                          ((cols[j] >> (i + 1)) << i);
        }
     
    return std::make_pair(count, count2);
}